

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O2

boolean ecx_poperror(ecx_contextt *context,ec_errort *Ec)

{
  short sVar1;
  short sVar2;
  ec_eringt *peVar3;
  ec_timet eVar4;
  ec_timet eVar5;
  anon_union_8_2_f8b78f4e_for_ec_errort_6 aVar6;
  ec_errort *peVar7;
  uint8 uVar8;
  undefined1 uVar9;
  ec_err_type eVar10;
  short sVar11;
  short sVar12;
  
  peVar3 = context->elist;
  sVar1 = peVar3->head;
  sVar2 = peVar3->tail;
  eVar4 = peVar3->Error[sVar2].Time;
  eVar5 = (&peVar3->Error[sVar2].Time)[1];
  peVar7 = peVar3->Error + sVar2;
  uVar8 = peVar7->SubIdx;
  uVar9 = peVar7->field_0xf;
  eVar10 = peVar7->Etype;
  aVar6 = *(anon_union_8_2_f8b78f4e_for_ec_errort_6 *)(&peVar7->Index + 4);
  Ec->Index = peVar7->Index;
  Ec->SubIdx = uVar8;
  Ec->field_0xf = uVar9;
  Ec->Etype = eVar10;
  Ec->field_6 = aVar6;
  Ec->Time = eVar4;
  *(ec_timet *)&Ec->Signal = eVar5;
  peVar3 = context->elist;
  sVar11 = peVar3->tail;
  peVar3->Error[sVar11].Signal = '\0';
  if (sVar1 == sVar2) {
    *context->ecaterror = '\0';
  }
  else {
    sVar11 = sVar11 + 1;
    sVar12 = 0;
    if (sVar11 < 0x41) {
      sVar12 = sVar11;
    }
    peVar3->tail = sVar12;
  }
  return sVar1 != sVar2;
}

Assistant:

boolean ecx_poperror(ecx_contextt *context, ec_errort *Ec)
{
   boolean notEmpty = (context->elist->head != context->elist->tail);

   *Ec = context->elist->Error[context->elist->tail];
   context->elist->Error[context->elist->tail].Signal = FALSE;
   if (notEmpty)
   {
      context->elist->tail++;
      if (context->elist->tail > EC_MAXELIST)
      {
         context->elist->tail = 0;
      }
   }
   else
   {
      *(context->ecaterror) = FALSE;
   }
   return notEmpty;
}